

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

void __thiscall
testing::internal::UnorderedElementsAreMatcherImpl<std::vector<void*,std::allocator<void*>>const&>::
UnorderedElementsAreMatcherImpl<__gnu_cxx::__normal_iterator<void*const*,std::vector<void*,std::allocator<void*>>>>
          (UnorderedElementsAreMatcherImpl<std::vector<void*,std::allocator<void*>>const&> *this,
          Flags matcher_flags,
          __normal_iterator<void_*const_*,_std::vector<void_*,_std::allocator<void_*>_>_> first,
          __normal_iterator<void_*const_*,_std::vector<void_*,_std::allocator<void_*>_>_> last)

{
  bool bVar1;
  testing *this_00;
  MatcherDescriberVec *this_01;
  void **matcher;
  MatcherDescriberInterface *local_78;
  MatcherBase<void_*const_&> *local_70;
  Matcher<void_*const_&> *m;
  iterator __end0;
  iterator __begin0;
  vector<testing::Matcher<void_*const_&>,_std::allocator<testing::Matcher<void_*const_&>_>_>
  *__range3;
  Flags local_24;
  UnorderedElementsAreMatcherImpl<std::vector<void*,std::allocator<void*>>const&> *pUStack_20;
  Flags matcher_flags_local;
  UnorderedElementsAreMatcherImpl<const_std::vector<void_*,_std::allocator<void_*>_>_&> *this_local;
  __normal_iterator<void_*const_*,_std::vector<void_*,_std::allocator<void_*>_>_> last_local;
  __normal_iterator<void_*const_*,_std::vector<void_*,_std::allocator<void_*>_>_> first_local;
  
  local_24 = matcher_flags;
  pUStack_20 = this;
  this_local = (UnorderedElementsAreMatcherImpl<const_std::vector<void_*,_std::allocator<void_*>_>_&>
                *)last._M_current;
  last_local = first;
  MatcherInterface<const_std::vector<void_*,_std::allocator<void_*>_>_&>::MatcherInterface
            ((MatcherInterface<const_std::vector<void_*,_std::allocator<void_*>_>_&> *)this);
  UnorderedElementsAreMatcherImplBase::UnorderedElementsAreMatcherImplBase
            ((UnorderedElementsAreMatcherImplBase *)(this + 8),local_24);
  *(undefined ***)this = &PTR__UnorderedElementsAreMatcherImpl_029a23a0;
  std::vector<testing::Matcher<void_*const_&>,_std::allocator<testing::Matcher<void_*const_&>_>_>::
  vector((vector<testing::Matcher<void_*const_&>,_std::allocator<testing::Matcher<void_*const_&>_>_>
          *)(this + 0x28));
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&last_local,
                       (__normal_iterator<void_*const_*,_std::vector<void_*,_std::allocator<void_*>_>_>
                        *)&this_local);
    if (!bVar1) break;
    this_00 = (testing *)
              __gnu_cxx::
              __normal_iterator<void_*const_*,_std::vector<void_*,_std::allocator<void_*>_>_>::
              operator*(&last_local);
    MatcherCast<void*const&,void*>((Matcher<void_*const_&> *)&__range3,this_00,matcher);
    std::vector<testing::Matcher<void_*const_&>,_std::allocator<testing::Matcher<void_*const_&>_>_>
    ::push_back((vector<testing::Matcher<void_*const_&>,_std::allocator<testing::Matcher<void_*const_&>_>_>
                 *)(this + 0x28),(value_type *)&__range3);
    Matcher<void_*const_&>::~Matcher((Matcher<void_*const_&> *)&__range3);
    __gnu_cxx::__normal_iterator<void_*const_*,_std::vector<void_*,_std::allocator<void_*>_>_>::
    operator++(&last_local);
  }
  __end0 = std::
           vector<testing::Matcher<void_*const_&>,_std::allocator<testing::Matcher<void_*const_&>_>_>
           ::begin((vector<testing::Matcher<void_*const_&>,_std::allocator<testing::Matcher<void_*const_&>_>_>
                    *)(this + 0x28));
  m = (Matcher<void_*const_&> *)
      std::
      vector<testing::Matcher<void_*const_&>,_std::allocator<testing::Matcher<void_*const_&>_>_>::
      end((vector<testing::Matcher<void_*const_&>,_std::allocator<testing::Matcher<void_*const_&>_>_>
           *)(this + 0x28));
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<testing::Matcher<void_*const_&>_*,_std::vector<testing::Matcher<void_*const_&>,_std::allocator<testing::Matcher<void_*const_&>_>_>_>
                                *)&m);
    if (!bVar1) break;
    local_70 = &__gnu_cxx::
                __normal_iterator<testing::Matcher<void_*const_&>_*,_std::vector<testing::Matcher<void_*const_&>,_std::allocator<testing::Matcher<void_*const_&>_>_>_>
                ::operator*(&__end0)->super_MatcherBase<void_*const_&>;
    this_01 = UnorderedElementsAreMatcherImplBase::matcher_describers
                        ((UnorderedElementsAreMatcherImplBase *)(this + 8));
    local_78 = MatcherBase<void_*const_&>::GetDescriber(local_70);
    std::
    vector<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
    ::push_back(this_01,&local_78);
    __gnu_cxx::
    __normal_iterator<testing::Matcher<void_*const_&>_*,_std::vector<testing::Matcher<void_*const_&>,_std::allocator<testing::Matcher<void_*const_&>_>_>_>
    ::operator++(&__end0);
  }
  return;
}

Assistant:

UnorderedElementsAreMatcherImpl(UnorderedMatcherRequire::Flags matcher_flags,
                                  InputIter first, InputIter last)
      : UnorderedElementsAreMatcherImplBase(matcher_flags) {
    for (; first != last; ++first) {
      matchers_.push_back(MatcherCast<const Element&>(*first));
    }
    for (const auto& m : matchers_) {
      matcher_describers().push_back(m.GetDescriber());
    }
  }